

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O2

void __thiscall Infector::AnyShared<BGVS>::setPtr(AnyShared<BGVS> *this,void *p)

{
  std::__shared_ptr<BGVS,_(__gnu_cxx::_Lock_policy)2>::reset<BGVS>
            (&(this->ist).super___shared_ptr<BGVS,_(__gnu_cxx::_Lock_policy)2>,(BGVS *)p);
  resolve_multiple_cast<BGVS>(this,(BGVS *)p);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }